

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave.c
# Opt level: O0

void delist_object(chunk_conflict *c,object *obj)

{
  object *obj_local;
  chunk_conflict *c_local;
  
  if (obj->oidx != 0) {
    if (c->objects[obj->oidx] != obj) {
      __assert_fail("c->objects[obj->oidx] == obj",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/cave.c"
                    ,0x1e8,"void delist_object(struct chunk *, struct object *)");
    }
    if ((c != cave) || (player->cave->objects[obj->oidx] == (object *)0x0)) {
      c->objects[obj->oidx] = (object *)0x0;
      obj->oidx = 0;
    }
  }
  return;
}

Assistant:

void delist_object(struct chunk *c, struct object *obj)
{
	if (!obj->oidx) return;
	assert(c->objects[obj->oidx] == obj);

	/* Don't delist an actual object if it still has a listed known object */
	if ((c == cave) && player->cave->objects[obj->oidx]) return;

	c->objects[obj->oidx] = NULL;
	obj->oidx = 0;
}